

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_tooltip_end(nk_context *ctx)

{
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x630e,"void nk_tooltip_end(struct nk_context *)");
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x630f,"void nk_tooltip_end(struct nk_context *)");
  }
  if ((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) {
    ctx->current->seq = ctx->current->seq - 1;
    nk_popup_close(ctx);
    nk_popup_end(ctx);
  }
  return;
}

Assistant:

NK_API void
nk_tooltip_end(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current) return;
    ctx->current->seq--;
    nk_popup_close(ctx);
    nk_popup_end(ctx);
}